

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O3

bool correctActionContext(ShortcutContext context,QAction *a,QWidget *active_window)

{
  long lVar1;
  QWidget *w;
  char cVar2;
  bool bVar3;
  QMenu *this;
  QAction *a_00;
  QGraphicsWidget *w_00;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window == (QWidget *)0x0) {
    bVar3 = false;
  }
  else {
    QAction::associatedObjects();
    lVar4 = 0;
    do {
      w = *(QWidget **)(&DAT_aaaaaaaaaaaaaaaa + lVar4);
      this = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (this == (QMenu *)0x0) {
        if ((w == (QWidget *)0x0) || ((*(byte *)(*(long *)&w->field_0x8 + 0x30) & 1) == 0)) {
          w_00 = (QGraphicsWidget *)QMetaObject::cast((QObject *)&QGraphicsWidget::staticMetaObject)
          ;
          if (w_00 == (QGraphicsWidget *)0x0) goto LAB_0039e3cb;
          bVar3 = correctGraphicsWidgetContext(context,w_00,active_window);
        }
        else {
          bVar3 = correctWidgetContext(context,w,active_window);
        }
LAB_0039e3c7:
        if (bVar3 != false) {
          bVar3 = true;
          goto LAB_0039e3da;
        }
      }
      else {
        a_00 = QMenu::menuAction(this);
        cVar2 = QAction::isVisible();
        if ((cVar2 != '\0') && (cVar2 = QAction::isEnabled(), cVar2 != '\0')) {
          bVar3 = correctActionContext(context,a_00,active_window);
          goto LAB_0039e3c7;
        }
      }
LAB_0039e3cb:
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x5555555555555550);
    bVar3 = false;
LAB_0039e3da:
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool correctActionContext(Qt::ShortcutContext context, QAction *a, QWidget *active_window)
{
    if (!active_window)
        return false;

    const QObjectList associatedObjects = a->associatedObjects();
#if defined(DEBUG_QSHORTCUTMAP)
    if (associatedObjects.isEmpty())
        qDebug() << a << "not connected to any widgets; won't trigger";
#endif
    for (auto object : associatedObjects) {
#if QT_CONFIG(menu)
        if (auto menu = qobject_cast<QMenu *>(object)) {
#ifdef Q_OS_DARWIN
            // On Mac, menu item shortcuts are processed before reaching any window.
            // That means that if a menu action shortcut has not been already processed
            // (and reaches this point), then the menu item itself has been disabled.
            // This occurs at the QPA level on Mac, where we disable all the Cocoa menus
            // when showing a modal window. (Notice that only the QPA menu is disabled,
            // not the QMenu.) Since we can also reach this code by climbing the menu
            // hierarchy (see below), or when the shortcut is not a key-equivalent, we
            // need to check whether the QPA menu is actually disabled.
            // When there is no QPA menu, there will be no QCocoaMenuDelegate checking
            // for the actual shortcuts. We can then fallback to our own logic.
            QPlatformMenu *pm = menu->platformMenu();
            if (pm && !pm->isEnabled())
                continue;
#endif
            QAction *a = menu->menuAction();
            if (a->isVisible() && a->isEnabled() && correctActionContext(context, a, active_window))
                return true;
        } else
#endif
        if (auto widget = qobject_cast<QWidget*>(object)) {
            if (correctWidgetContext(context, widget, active_window))
                return true;
        }
#if QT_CONFIG(graphicsview)
        else if (auto graphicsWidget = qobject_cast<QGraphicsWidget*>(object)) {
            if (correctGraphicsWidgetContext(context, graphicsWidget, active_window))
                return true;
        }
#endif
    }

    return false;
}